

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O3

void __thiscall Matrix::Matrix(Matrix *this,int nx,int ny)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong __new_size;
  
  this_00 = &this->col_inds;
  this_01 = &this->values;
  uVar8 = ny * nx;
  (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->col_inds).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->col_inds).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->row_ptrs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->col_inds).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->row_ptrs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->row_ptrs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->row_ptrs,(long)(int)(uVar8 + 1));
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(int)(uVar8 * 5));
  std::vector<double,_std::allocator<double>_>::resize(this_01,(long)(int)(uVar8 * 5));
  piVar1 = (this->row_ptrs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar1 = 0;
  __new_size = 0;
  if (0 < (int)uVar8) {
    piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    do {
      iVar11 = (int)__new_size;
      iVar6 = (int)uVar7;
      iVar10 = (int)((long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) % (long)nx);
      iVar13 = (int)((long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) / (long)nx);
      iVar4 = nx + iVar6;
      if (iVar13 == ny + -1) {
        iVar4 = -1;
      }
      iVar12 = iVar11;
      if (iVar6 - nx != -1 && iVar13 != 0) {
        piVar2[iVar11] = iVar6 - nx;
        iVar12 = iVar11 + 1;
        pdVar3[iVar11] = -1.0;
      }
      uVar9 = -(uint)(iVar10 == 0) | iVar6 - 1U;
      iVar13 = iVar12;
      if (uVar9 != 0xffffffff) {
        piVar2[iVar12] = uVar9;
        iVar13 = iVar12 + 1;
        pdVar3[iVar12] = -1.0;
      }
      uVar5 = iVar13 + 1;
      piVar2[iVar13] = iVar6;
      pdVar3[iVar13] = 4.0;
      uVar9 = uVar5;
      if (iVar10 != nx + -1) {
        piVar2[(int)uVar5] = iVar6 + 1;
        uVar9 = iVar13 + 2;
        pdVar3[(int)uVar5] = -1.0;
      }
      if (iVar4 != -1) {
        piVar2[(int)uVar9] = iVar4;
        pdVar3[(int)uVar9] = -1.0;
        uVar9 = uVar9 + 1;
      }
      __new_size = (ulong)uVar9;
      piVar1[uVar7 + 1] = uVar9;
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
    __new_size = (ulong)(int)uVar9;
  }
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
  return;
}

Assistant:

Matrix::Matrix(int nx, int ny) {
    int num_rows = nx*ny;
    int nnz_est  = 5*num_rows;

    row_ptrs.resize(num_rows+1);
    col_inds.resize(nnz_est);
    values  .resize(nnz_est);

    int center, left, right, lower, upper, ind = 0;

    row_ptrs[0] = 0;
    for (int i = 0; i < num_rows; i++) {
        center = i;

        get_2d_neighbors(center, nx, ny, left, right, lower, upper);

        if (lower != -1) { col_inds[ind] = lower; values[ind++] = -1; }
        if (left  != -1) { col_inds[ind] = left;  values[ind++] = -1; }

        col_inds[ind] = center; values[ind++] = 4;

        if (right != -1) { col_inds[ind] = right; values[ind++] = -1; }
        if (upper != -1) { col_inds[ind] = upper; values[ind++] = -1; }

        row_ptrs[i+1] = ind;
    }
    col_inds.resize(ind);
    values  .resize(ind);
}